

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

int64_t pick_intra_angle_routine_sbuv
                  (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int rate_overhead,int64_t best_rd_in
                  ,int *rate,RD_STATS *rd_stats,int *best_angle_delta,int64_t *best_rd)

{
  long lVar1;
  int iVar2;
  long in_RSI;
  int *in_R9;
  MB_MODE_INFO *unaff_retaddr;
  RD_STATS tokenonly_rd_stats;
  int64_t this_rd;
  int64_t in_stack_00000038;
  int this_rate;
  MB_MODE_INFO *mbmi;
  undefined3 in_stack_0000005c;
  undefined4 local_70;
  undefined8 local_68;
  undefined1 local_50;
  undefined8 in_stack_fffffffffffffff8;
  long lVar3;
  
  lVar1 = **(long **)(in_RSI + 0x2058);
  iVar2 = av1_txfm_uvrd((AV1_COMP *)CONCAT44(_in_stack_0000005c,rate_overhead),
                        (MACROBLOCK *)best_rd_in,(RD_STATS *)rate,mbmi._7_1_,in_stack_00000038);
  if (iVar2 == 0) {
    lVar3 = 0x7fffffffffffffff;
  }
  else {
    iVar2 = intra_mode_info_cost_uv
                      ((AV1_COMP *)tokenonly_rd_stats.dist,(MACROBLOCK *)tokenonly_rd_stats._0_8_,
                       unaff_retaddr,(BLOCK_SIZE)((ulong)in_stack_fffffffffffffff8 >> 0x38),
                       (int)in_stack_fffffffffffffff8);
    lVar3 = ((long)(local_70 + iVar2) * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
            local_68 * 0x80;
    if (lVar3 < *(long *)tokenonly_rd_stats.rdcost) {
      *(long *)tokenonly_rd_stats.rdcost = lVar3;
      *(int *)tokenonly_rd_stats.dist = (int)*(char *)(lVar1 + 0x59);
      *in_R9 = local_70 + iVar2;
      *(int *)tokenonly_rd_stats._0_8_ = local_70;
      *(long *)(tokenonly_rd_stats._0_8_ + 8) = local_68;
      *(undefined1 *)(tokenonly_rd_stats._0_8_ + 0x20) = local_50;
    }
  }
  return lVar3;
}

Assistant:

static int64_t pick_intra_angle_routine_sbuv(
    const AV1_COMP *const cpi, MACROBLOCK *x, BLOCK_SIZE bsize,
    int rate_overhead, int64_t best_rd_in, int *rate, RD_STATS *rd_stats,
    int *best_angle_delta, int64_t *best_rd) {
  MB_MODE_INFO *mbmi = x->e_mbd.mi[0];
  assert(!is_inter_block(mbmi));
  int this_rate;
  int64_t this_rd;
  RD_STATS tokenonly_rd_stats;

  if (!av1_txfm_uvrd(cpi, x, &tokenonly_rd_stats, bsize, best_rd_in))
    return INT64_MAX;
  this_rate = tokenonly_rd_stats.rate +
              intra_mode_info_cost_uv(cpi, x, mbmi, bsize, rate_overhead);
  this_rd = RDCOST(x->rdmult, this_rate, tokenonly_rd_stats.dist);
  if (this_rd < *best_rd) {
    *best_rd = this_rd;
    *best_angle_delta = mbmi->angle_delta[PLANE_TYPE_UV];
    *rate = this_rate;
    rd_stats->rate = tokenonly_rd_stats.rate;
    rd_stats->dist = tokenonly_rd_stats.dist;
    rd_stats->skip_txfm = tokenonly_rd_stats.skip_txfm;
  }
  return this_rd;
}